

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O3

void __thiscall wallet::PageHeader::Unserialize<AutoFile>(PageHeader *this,AutoFile *s)

{
  uint16_t *puVar1;
  uint uVar2;
  uint uVar3;
  runtime_error *this_00;
  uint uVar4;
  size_t in_RCX;
  long in_FS_OFFSET;
  uint32_t obj;
  uint32_t local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->lsn_file = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->lsn_offset = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->page_num = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->prev_page = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->next_page = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x2,in_RCX);
  this->entries = (uint16_t)local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x2,in_RCX);
  this->hf_offset = (uint16_t)local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x1,in_RCX);
  this->level = (PageType)local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x1,in_RCX);
  this->type = (PageType)local_24;
  uVar4 = this->page_num;
  if (this->other_endian == true) {
    uVar2 = this->lsn_file;
    uVar3 = this->lsn_offset;
    this->lsn_file = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
    ;
    this->lsn_offset =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    this->page_num = uVar4;
    uVar2 = this->prev_page;
    this->prev_page =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = this->next_page;
    this->next_page =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    puVar1 = &this->entries;
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
    puVar1 = &this->hf_offset;
    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  }
  if (this->expected_page_num == uVar4) {
    if ((this->level == '\0') != ((PageType)local_24 != OVERFLOW_DATA)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return;
      }
      goto LAB_0056a78d;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Bad btree level");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Page number mismatch");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_0056a78d:
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> lsn_file;
        s >> lsn_offset;
        s >> page_num;
        s >> prev_page;
        s >> next_page;
        s >> entries;
        s >> hf_offset;
        s >> level;

        uint8_t uint8_type;
        s >> uint8_type;
        type = static_cast<PageType>(uint8_type);

        if (other_endian) {
            lsn_file = internal_bswap_32(lsn_file);
            lsn_offset = internal_bswap_32(lsn_offset);
            page_num = internal_bswap_32(page_num);
            prev_page = internal_bswap_32(prev_page);
            next_page = internal_bswap_32(next_page);
            entries = internal_bswap_16(entries);
            hf_offset = internal_bswap_16(hf_offset);
        }

        if (expected_page_num != page_num) {
            throw std::runtime_error("Page number mismatch");
        }
        if ((type != PageType::OVERFLOW_DATA && level < 1) || (type == PageType::OVERFLOW_DATA && level != 0)) {
            throw std::runtime_error("Bad btree level");
        }
    }